

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

MessageBuilder * __thiscall el::base::MessageBuilder::operator<<(MessageBuilder *this,char *msg)

{
  size_t sVar1;
  undefined1 *puVar2;
  
  puVar2 = &this->m_logger->field_0x50;
  if (msg == (char *)0x0) {
    std::ios::clear((int)puVar2 + (int)*(undefined8 *)(*(long *)puVar2 + -0x18));
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,msg,sVar1);
  }
  if ((*(byte *)(elStorage + 0x19) & 0x20) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->m_logger->field_0x50," ",1)
    ;
  }
  return this;
}

Assistant:

inline MessageBuilder& operator<<(const std::wstring& msg) {
    return operator<<(msg.c_str());
  }